

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

size_t __thiscall libchars::command_cursor::current_length(command_cursor *this)

{
  ulong uVar1;
  _Elt_pointer ppcVar2;
  
  ppcVar2 = (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar2 ==
      (this->S).c.
      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur) {
    if (this->root != (command_node *)0x0) {
      uVar1 = (this->root->part)._M_string_length;
      if (uVar1 < this->root_idx) {
        return 0;
      }
      return uVar1 - this->root_idx;
    }
  }
  else {
    if (ppcVar2 ==
        (this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppcVar2 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (ppcVar2[-1] != (command_node *)0x0) {
      return (ppcVar2[-1]->part)._M_string_length;
    }
  }
  return 0;
}

Assistant:

size_t command_cursor::current_length() const
    {
        if (S.empty()) {
            if (root != NULL && root_idx < root->part.length())
                return (root->part.length() - root_idx);
        }
        else {
            command_node *n = S.top();
            if (n != NULL)
                return n->part.length();
        }
        return 0;
    }